

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector_test.cc
# Opt level: O0

void __thiscall
fizplex::SVectorTest_ReorderedVectorsAreEqual_Test::TestBody
          (SVectorTest_ReorderedVectorsAreEqual_Test *this)

{
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  bool bVar7;
  char *pcVar8;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  SVector w;
  SVector v;
  SVector *in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde1;
  undefined1 in_stack_fffffffffffffde2;
  undefined1 in_stack_fffffffffffffde3;
  undefined1 in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde5;
  undefined1 in_stack_fffffffffffffde6;
  string local_218;
  AssertHelper local_1f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  size_type in_stack_fffffffffffffe20;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  byte local_199;
  internal local_198 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe70;
  SVector *in_stack_fffffffffffffe78;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_151;
  AssertionResult local_150;
  string local_140;
  AssertHelper local_120;
  Message local_118;
  undefined1 local_109;
  AssertionResult local_108 [2];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_30;
  undefined8 local_28;
  
  local_48 = 7;
  uStack_40 = 0xc000e147ae147ae1;
  local_58 = 2;
  uStack_50 = 0x4022000000000000;
  local_68 = 1;
  uStack_60 = 0x4008000000000000;
  local_78 = 0;
  uStack_70 = 0xc000000000000000;
  local_30 = &local_78;
  local_28 = 4;
  l._M_array._7_1_ = in_stack_fffffffffffffe1f;
  l._M_array._0_7_ = in_stack_fffffffffffffe18;
  l._M_len = in_stack_fffffffffffffe20;
  SVector::SVector((SVector *)in_stack_fffffffffffffe10.ptr_,l);
  local_b8 = 1;
  uStack_b0 = 0x4008000000000000;
  local_c8 = 7;
  uStack_c0 = 0xc000e147ae147ae1;
  local_d8 = 0;
  uStack_d0 = 0xc000000000000000;
  local_e8 = 2;
  uStack_e0 = 0x4022000000000000;
  local_a0 = &local_e8;
  local_98 = 4;
  l_00._M_array._7_1_ = in_stack_fffffffffffffe1f;
  l_00._M_array._0_7_ = in_stack_fffffffffffffe18;
  l_00._M_len = in_stack_fffffffffffffe20;
  SVector::SVector((SVector *)in_stack_fffffffffffffe10.ptr_,l_00);
  uVar1 = SVector::operator==(in_stack_fffffffffffffe78,(SVector *)in_stack_fffffffffffffe70.ptr_);
  local_109 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,
                                     CONCAT15(in_stack_fffffffffffffde5,
                                              CONCAT14(in_stack_fffffffffffffde4,
                                                       CONCAT13(in_stack_fffffffffffffde3,
                                                                CONCAT12(in_stack_fffffffffffffde2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
             (bool *)in_stack_fffffffffffffdd8,(type *)0x1b10fc);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)local_108,(AssertionResult *)"v == w","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x1e,pcVar8);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    testing::Message::~Message((Message *)0x1b1214);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b128c);
  uVar3 = SVector::operator==(in_stack_fffffffffffffe78,(SVector *)in_stack_fffffffffffffe70.ptr_);
  local_151 = uVar3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffde4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
             ,(bool *)in_stack_fffffffffffffdd8,(type *)0x1b12cd);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!(bool)uVar4) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xfffffffffffffe78,(internal *)&local_150,(AssertionResult *)"w == v"
               ,"false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x1f,pcVar8);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
    testing::Message::~Message((Message *)0x1b13c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b143d);
  uVar5 = SVector::operator!=((SVector *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  in_stack_fffffffffffffde3,
                                                  CONCAT12(in_stack_fffffffffffffde2,
                                                           CONCAT11(in_stack_fffffffffffffde1,
                                                                    in_stack_fffffffffffffde0)))))))
                              ,in_stack_fffffffffffffdd8);
  local_199 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffde2,
                                                  CONCAT11(in_stack_fffffffffffffde1,
                                                           in_stack_fffffffffffffde0))))))),
             (bool *)in_stack_fffffffffffffdd8,(type *)0x1b1480);
  uVar6 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!(bool)uVar6) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,local_198,(AssertionResult *)"!(v != w)","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x20,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::Message::~Message((Message *)0x1b1566);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b15d8);
  bVar7 = SVector::operator!=((SVector *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  uVar5,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_fffffffffffffde1,
                                                  in_stack_fffffffffffffde0))))))),
                              in_stack_fffffffffffffdd8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  uVar6,CONCAT11(bVar7,in_stack_fffffffffffffde0))))
                                                  ))),(bool *)in_stack_fffffffffffffdd8,
             (type *)0x1b1612);
  bVar7 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe20);
  if (!bVar7) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_218,(internal *)&stack0xfffffffffffffe20,(AssertionResult *)"!(w != v)",
               "false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x21,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&stack0xfffffffffffffe10);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    testing::Message::~Message((Message *)0x1b16e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b1755);
  SVector::~SVector((SVector *)0x1b1762);
  SVector::~SVector((SVector *)0x1b176f);
  return;
}

Assistant:

TEST(SVectorTest, ReorderedVectorsAreEqual) {
  const SVector v = {{0, -2}, {1, 3}, {2, 9}, {7, -2.11}};
  const SVector w = {{2, 9}, {0, -2}, {7, -2.11}, {1, 3}};
  EXPECT_TRUE(v == w);
  EXPECT_TRUE(w == v);
  EXPECT_TRUE(!(v != w));
  EXPECT_TRUE(!(w != v));
}